

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
Stack1_advanced_Move_Test::~Stack1_advanced_Move_Test(Stack1_advanced_Move_Test *this)

{
  Stack1_advanced_Move_Test *this_local;
  
  ~Stack1_advanced_Move_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Stack1_advanced, Move) {
	SimpleStack<int> s(1234);
	SimpleStack<int> z(std::move(s));
	EXPECT_EQ(z.head(), 1234);
	EXPECT_TRUE(!s);
	s = std::move(z);
	EXPECT_EQ(s.head(), 1234);
	EXPECT_TRUE(!z);
}